

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum_core.cpp
# Opt level: O2

int mbedtls_mpi_core_write_be(mbedtls_mpi_uint *X,size_t X_limbs,uchar *output,size_t output_length)

{
  int iVar1;
  ulong uVar2;
  size_t __n;
  long lVar3;
  byte bVar4;
  size_t sVar5;
  ulong uVar6;
  ulong uVar7;
  
  uVar7 = X_limbs * 8;
  __n = output_length + X_limbs * -8;
  if (output_length < uVar7 || __n == 0) {
    lVar3 = output_length * 8;
    iVar1 = -8;
    sVar5 = output_length;
    do {
      uVar2 = output_length;
      if (uVar7 == sVar5) goto LAB_00385411;
      uVar2 = sVar5 & 0xfffffffffffffff8;
      bVar4 = (byte)lVar3;
      sVar5 = sVar5 + 1;
      lVar3 = lVar3 + 8;
    } while ((char)(*(ulong *)((long)X + uVar2) >> (bVar4 & 0x38)) == '\0');
  }
  else {
    memset(output,0,__n);
    uVar2 = uVar7;
LAB_00385411:
    if (output_length <= uVar7) {
      output_length = uVar7;
    }
    iVar1 = 0;
    bVar4 = 0;
    uVar6 = 0;
    while (uVar2 != 0) {
      output[uVar2 + output_length + ~uVar7] =
           (uchar)(*(ulong *)((long)X + (uVar6 & 0xfffffffffffffff8)) >> (bVar4 & 0x38));
      uVar6 = uVar6 + 1;
      bVar4 = bVar4 + 8;
      uVar2 = uVar2 - 1;
    }
  }
  return iVar1;
}

Assistant:

int mbedtls_mpi_core_write_be(const mbedtls_mpi_uint *X,
                              size_t X_limbs,
                              unsigned char *output,
                              size_t output_length)
{
    size_t stored_bytes;
    size_t bytes_to_copy;
    unsigned char *p;

    stored_bytes = X_limbs * ciL;

    if (stored_bytes < output_length) {
        /* There is enough space in the output buffer. Write initial
         * null bytes and record the position at which to start
         * writing the significant bytes. In this case, the execution
         * trace of this function does not depend on the value of the
         * number. */
        bytes_to_copy = stored_bytes;
        p = output + output_length - stored_bytes;
        memset(output, 0, output_length - stored_bytes);
    } else {
        /* The output buffer is smaller than the allocated size of X.
         * However X may fit if its leading bytes are zero. */
        bytes_to_copy = output_length;
        p = output;
        for (size_t i = bytes_to_copy; i < stored_bytes; i++) {
            if (GET_BYTE(X, i) != 0) {
                return MBEDTLS_ERR_MPI_BUFFER_TOO_SMALL;
            }
        }
    }

    for (size_t i = 0; i < bytes_to_copy; i++) {
        p[bytes_to_copy - i - 1] = GET_BYTE(X, i);
    }

    return 0;
}